

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O1

int string_is_numeric(char *value)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = strlen(value);
  iVar2 = -0x14;
  if (((sVar3 != 0) && ((sVar3 != 1 || ((byte)(*value - 0x30U) < 10)))) &&
     ((cVar1 = *value, (byte)(cVar1 - 0x30U) < 10 || ((cVar1 == '-' || (cVar1 == '+')))))) {
    if (1 < sVar3) {
      sVar4 = 1;
      do {
        if (9 < (byte)(value[sVar4] - 0x30U)) {
          return -0x14;
        }
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int string_is_numeric (const char* value)
{
       size_t len = strlen(value);
       size_t i;

       if (len == 0) {
               return (ARCHIVE_WARN);
       }
       else if (len == 1 && !(value[0] >= '0' && value[0] <= '9')) {
               return (ARCHIVE_WARN);
       }
       else if (!(value[0] >= '0' && value[0] <= '9') &&
                value[0] != '-' && value[0] != '+') {
               return (ARCHIVE_WARN);
       }

       for (i = 1; i < len; i++) {
               if (!(value[i] >= '0' && value[i] <= '9')) {
                       return (ARCHIVE_WARN);
               }
       }

       return (ARCHIVE_OK);
}